

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

void update_txk_array(MACROBLOCKD *xd,int blk_row,int blk_col,TX_SIZE tx_size,TX_TYPE tx_type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int idx;
  int idy;
  int tx_unit;
  int txh;
  int txw;
  int stride;
  TX_TYPE tx_type_local;
  TX_SIZE tx_size_local;
  int blk_col_local;
  int blk_row_local;
  MACROBLOCKD *xd_local;
  
  iVar1 = xd->tx_type_map_stride;
  xd->tx_type_map[blk_row * iVar1 + blk_col] = tx_type;
  iVar2 = tx_size_wide_unit[tx_size];
  iVar3 = tx_size_high_unit[tx_size];
  if ((iVar2 == 0x10) || (iVar3 == 0x10)) {
    for (idy = 0; idy < iVar3; idy = idy + 4) {
      for (idx = 0; idx < iVar2; idx = idx + 4) {
        xd->tx_type_map[(blk_row + idy) * iVar1 + blk_col + idx] = tx_type;
      }
    }
  }
  return;
}

Assistant:

static inline void update_txk_array(MACROBLOCKD *const xd, int blk_row,
                                    int blk_col, TX_SIZE tx_size,
                                    TX_TYPE tx_type) {
  const int stride = xd->tx_type_map_stride;
  xd->tx_type_map[blk_row * stride + blk_col] = tx_type;

  const int txw = tx_size_wide_unit[tx_size];
  const int txh = tx_size_high_unit[tx_size];
  // The 16x16 unit is due to the constraint from tx_64x64 which sets the
  // maximum tx size for chroma as 32x32. Coupled with 4x1 transform block
  // size, the constraint takes effect in 32x16 / 16x32 size too. To solve
  // the intricacy, cover all the 16x16 units inside a 64 level transform.
  if (txw == tx_size_wide_unit[TX_64X64] ||
      txh == tx_size_high_unit[TX_64X64]) {
    const int tx_unit = tx_size_wide_unit[TX_16X16];
    for (int idy = 0; idy < txh; idy += tx_unit) {
      for (int idx = 0; idx < txw; idx += tx_unit) {
        xd->tx_type_map[(blk_row + idy) * stride + blk_col + idx] = tx_type;
      }
    }
  }
}